

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O0

void __thiscall Math_TwoSum_Test::TestBody(Math_TwoSum_Test *this)

{
  bool bVar1;
  undefined1 auVar2 [64];
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  CompensatedFloat tp;
  Float b;
  Float a;
  anon_class_8_1_ba1d750b r;
  RNG rng;
  int i;
  char *in_stack_ffffffffffffff18;
  RNG *in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff2c;
  anon_class_8_1_ba1d750b *in_stack_ffffffffffffff30;
  char *expected_expression;
  int line;
  char **file;
  Type type;
  AssertionResult *this_00;
  RNG local_80;
  Message *in_stack_ffffffffffffff98;
  AssertHelper *in_stack_ffffffffffffffa0;
  AssertionResult local_48;
  CompensatedFloat local_38;
  Float local_30;
  Float local_2c;
  char *local_28;
  char local_20 [20];
  int local_c;
  undefined1 extraout_var [56];
  
  for (local_c = 0; local_c < 100000; local_c = local_c + 1) {
    expected_expression = local_20;
    pbrt::RNG::RNG(in_stack_ffffffffffffff20,(uint64_t)in_stack_ffffffffffffff18);
    file = &local_28;
    type = 10;
    local_28 = expected_expression;
    local_2c = TestBody::anon_class_8_1_ba1d750b::operator()
                         (in_stack_ffffffffffffff30,(int)in_stack_ffffffffffffff2c,
                          (int)in_stack_ffffffffffffff28);
    local_30 = TestBody::anon_class_8_1_ba1d750b::operator()
                         (in_stack_ffffffffffffff30,(int)in_stack_ffffffffffffff2c,
                          (int)in_stack_ffffffffffffff28);
    auVar2._0_8_ = pbrt::TwoSum<float>(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    auVar2._8_56_ = extraout_var;
    local_38 = (CompensatedFloat)vmovlpd_avx(auVar2._0_16_);
    pbrt::CompensatedFloat::operator_cast_to_float(&local_38);
    this_00 = &local_48;
    testing::internal::EqHelper<false>::Compare<float,float>
              (expected_expression,(char *)in_stack_ffffffffffffff30,
               (float *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (float *)in_stack_ffffffffffffff20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_ffffffffffffff30 =
           (anon_class_8_1_ba1d750b *)
           testing::AssertionResult::failure_message((AssertionResult *)0x5fafe3);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,type,(char *)file,(int)((ulong)expected_expression >> 0x20)
                 ,(char *)in_stack_ffffffffffffff30);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff20);
      testing::Message::~Message((Message *)0x5fb037);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5fb08c);
    pbrt::CompensatedFloat::operator_cast_to_double(&local_38);
    in_stack_ffffffffffffff20 = &local_80;
    testing::internal::EqHelper<false>::Compare<double,double>
              (expected_expression,(char *)in_stack_ffffffffffffff30,
               (double *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (double *)in_stack_ffffffffffffff20);
    line = (int)((ulong)expected_expression >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)in_stack_ffffffffffffff20);
    in_stack_ffffffffffffff2c = (float)CONCAT13(bVar1,SUB43(in_stack_ffffffffffffff2c,0));
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_ffffffffffffff18 =
           testing::AssertionResult::failure_message((AssertionResult *)0x5fb14a);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,type,(char *)file,line,(char *)in_stack_ffffffffffffff30);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff20);
      testing::Message::~Message((Message *)0x5fb196);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5fb1e2);
  }
  return;
}

Assistant:

TEST(Math, TwoSum) {
    for (int i = 0; i < 100000; ++i) {
        RNG rng(i);
        auto r = [&rng](int minExp = -10, int maxExp = 10) {
            Float logu = Lerp(rng.Uniform<Float>(), minExp, maxExp);
            Float val = std::pow(10, logu);
            Float sign = rng.Uniform<Float>() < .5 ? -1. : 1.;
            return val * sign;
        };

        Float a = r(), b = r();
        CompensatedFloat tp = TwoSum(a, b);
        EXPECT_EQ((Float)tp, a + b);
        EXPECT_EQ((double)tp, (double)a + (double)b);
    }
}